

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_123::AsyncTee::ReadSink::fill
          (ReadSink *this,Buffer *inBuffer,
          Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_> *stoppage)

{
  undefined8 *puVar1;
  uint64_t uVar2;
  char *in_RCX;
  _Elt_pointer pAVar3;
  Exception local_1b0;
  
  uVar2 = Buffer::consume((Buffer *)stoppage,
                          (ArrayPtr<unsigned_char> *)
                          &(inBuffer->bufferList).
                           super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_first,
                          (size_t *)
                          &(inBuffer->bufferList).
                           super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node);
  pAVar3 = (_Elt_pointer)
           ((long)&((inBuffer->bufferList).
                    super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur)->ptr + uVar2);
  (inBuffer->bufferList).
  super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = pAVar3;
  if ((inBuffer->bufferList).
      super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>.
      _M_impl.super__Deque_impl_data._M_start._M_node != (_Map_pointer)0x0) {
    if (((uVar2 != 0) ||
        (*(long *)((long)&(stoppage->ptr).field_1 + 0x28) !=
         *(long *)((long)&(stoppage->ptr).field_1 + 8))) || (*in_RCX != '\x01')) goto LAB_00476679;
    if (*(int *)(in_RCX + 8) != 1 && pAVar3 == (_Elt_pointer)0x0) {
      Exception::Exception(&local_1b0,(Exception *)(in_RCX + 0x10));
      puVar1 = (undefined8 *)
               (inBuffer->bufferList).
               super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
               ._M_impl.super__Deque_impl_data._M_map_size;
      (**(code **)*puVar1)(puVar1,&local_1b0);
      pAVar3 = (inBuffer->bufferList).
               super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((Buffer *)pAVar3->ptr == inBuffer) {
        pAVar3->ptr = (uchar *)0x0;
      }
      Exception::~Exception(&local_1b0);
      goto LAB_00476679;
    }
  }
  local_1b0.ownFile.content.ptr = (char *)pAVar3;
  (**(code **)(*(long *)(inBuffer->bufferList).
                        super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                        ._M_impl.super__Deque_impl_data._M_map_size + 0x10))();
  pAVar3 = (inBuffer->bufferList).
           super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((Buffer *)pAVar3->ptr == inBuffer) {
    pAVar3->ptr = (uchar *)0x0;
  }
LAB_00476679:
  kj::_::readyNow();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> fill(Buffer& inBuffer, const Maybe<Stoppage>& stoppage) override {
      auto amount = inBuffer.consume(buffer, minBytes);
      readSoFar += amount;

      if (minBytes == 0) {
        // We satisfied the read request.
        fulfill(readSoFar);
        return READY_NOW;
      }

      if (amount == 0 && inBuffer.empty()) {
        // We made no progress on the read request and the buffer is tapped out.
        KJ_IF_SOME(reason, stoppage) {
          if (reason.is<Eof>() || readSoFar > 0) {
            // Prefer short read to exception.
            fulfill(readSoFar);
          } else {
            reject(cp(reason.get<Exception>()));
          }
          return READY_NOW;
        }
      }

      return READY_NOW;
    }